

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O2

bool __thiscall DOptionMenu::MenuEvent(DOptionMenu *this,int mkey,bool fromcontroller)

{
  uint uVar1;
  uint uVar2;
  FOptionMenuItem *pFVar3;
  bool bVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  undefined8 in_RAX;
  ulong uVar8;
  FOptionMenuDescriptor *pFVar9;
  int iVar10;
  undefined8 uStack_38;
  
  uVar5 = (undefined4)in_RAX;
  pFVar9 = this->mDesc;
  uVar1 = pFVar9->mSelectedItem;
  uVar8 = (ulong)uVar1;
  uStack_38 = in_RAX;
  uStack_38._0_4_ = uVar5;
  switch((ulong)(uint)mkey) {
  case 0:
    if (uVar1 != 0xffffffff) {
      do {
        iVar7 = (int)uVar8 + -1;
        pFVar9->mSelectedItem = iVar7;
        if ((0 < pFVar9->mScrollPos) && (iVar7 <= pFVar9->mScrollPos + pFVar9->mScrollTop)) {
          iVar6 = ~pFVar9->mScrollTop + iVar7;
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          pFVar9->mScrollPos = iVar6;
        }
        if ((int)uVar8 < 1) {
          iVar7 = pFVar9->mPosition;
          if (iVar7 < 1) {
            if ((BigFont == (FFont *)0x0) || (*(int *)((pFVar9->mTitle).Chars + -0xc) == 0)) {
              iVar7 = -iVar7;
            }
            else {
              iVar7 = BigFont->FontHeight - iVar7;
            }
          }
          uVar2 = (pFVar9->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
          iVar7 = ~(((screen->super_DSimpleCanvas).super_DCanvas.Height -
                    (iVar7 + OptionSettings.mLinespacing) * CleanYfac_1) /
                   (OptionSettings.mLinespacing * CleanYfac_1)) + uVar2 + pFVar9->mScrollTop;
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          pFVar9->mScrollPos = iVar7;
          iVar7 = uVar2 - 1;
          pFVar9->mSelectedItem = iVar7;
        }
        iVar7 = (*((pFVar9->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[iVar7]
                  ->super_FListMenuItem)._vptr_FListMenuItem[5])();
        if ((char)iVar7 != '\0') break;
        pFVar9 = this->mDesc;
        uVar8 = (ulong)(uint)pFVar9->mSelectedItem;
      } while (pFVar9->mSelectedItem != uVar1);
      goto LAB_00337431;
    }
    break;
  case 1:
    if (uVar1 != 0xffffffff) {
      do {
        iVar7 = (int)uVar8 + 1;
        pFVar9->mSelectedItem = iVar7;
        if ((this->CanScrollDown == true) && (iVar7 == this->VisBottom)) {
          pFVar9->mScrollPos = pFVar9->mScrollPos + 1;
          this->VisBottom = (int)uVar8 + 2;
        }
        if ((int)(pFVar9->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count <= iVar7)
        {
          pFVar9->mSelectedItem = 0;
          pFVar9->mScrollPos = 0;
          iVar7 = 0;
        }
        iVar7 = (*((pFVar9->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[iVar7]
                  ->super_FListMenuItem)._vptr_FListMenuItem[5])();
        if ((char)iVar7 != '\0') break;
        pFVar9 = this->mDesc;
        uVar8 = (ulong)(uint)pFVar9->mSelectedItem;
      } while (pFVar9->mSelectedItem != uVar1);
      goto LAB_00337431;
    }
    break;
  case 4:
    if (pFVar9->mScrollPos < 1) goto LAB_00337431;
    iVar7 = (pFVar9->mScrollPos * 2 - this->VisBottom) + pFVar9->mScrollTop;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    pFVar9->mScrollPos = iVar7;
    if (uVar1 == 0xffffffff) goto LAB_00337431;
    iVar7 = iVar7 + pFVar9->mScrollTop + 1;
    while( true ) {
      pFVar9->mSelectedItem = iVar7;
      iVar7 = (*((this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array
                 [this->mDesc->mSelectedItem]->super_FListMenuItem)._vptr_FListMenuItem[5])();
      pFVar9 = this->mDesc;
      if ((char)iVar7 != '\0') break;
      iVar7 = pFVar9->mSelectedItem + 1;
      if ((int)(pFVar9->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count <= iVar7) {
        iVar7 = 0;
      }
    }
    goto LAB_00337426;
  case 5:
    if (this->CanScrollDown != true) goto LAB_00337431;
    uVar2 = (pFVar9->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
    iVar7 = pFVar9->mScrollTop;
    iVar10 = (this->VisBottom - pFVar9->mScrollPos) - iVar7;
    iVar6 = pFVar9->mScrollPos + iVar10;
    pFVar9->mScrollPos = iVar6;
    iVar10 = iVar10 + iVar7;
    if ((int)uVar2 < iVar10 + iVar6) {
      iVar6 = uVar2 - iVar10;
      pFVar9->mScrollPos = iVar6;
    }
    if (uVar1 == 0xffffffff) goto LAB_00337431;
    iVar6 = iVar6 + iVar7;
    pFVar9->mSelectedItem = iVar6;
    while( true ) {
      iVar7 = (*((pFVar9->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[iVar6]->
                super_FListMenuItem)._vptr_FListMenuItem[5])();
      pFVar9 = this->mDesc;
      if ((char)iVar7 != '\0') break;
      iVar7 = pFVar9->mSelectedItem + 1;
      if ((int)(pFVar9->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count <= iVar7) {
        iVar7 = 0;
      }
      pFVar9->mSelectedItem = iVar7;
      pFVar9 = this->mDesc;
      iVar6 = pFVar9->mSelectedItem;
    }
LAB_00337426:
    if (pFVar9->mSelectedItem < pFVar9->mScrollPos) {
      pFVar9->mScrollPos = pFVar9->mSelectedItem;
    }
    goto LAB_00337431;
  case 6:
    if ((int)uVar1 < 0) goto LAB_003373fa;
    iVar7 = (*((pFVar9->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar8]->
              super_FListMenuItem)._vptr_FListMenuItem[6])();
    if ((char)iVar7 != '\0') {
      return true;
    }
    pFVar9 = this->mDesc;
    uVar8 = (ulong)(uint)pFVar9->mSelectedItem;
  default:
    if ((-1 < (int)uVar8) &&
       (pFVar3 = (pFVar9->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar8],
       iVar7 = (*(pFVar3->super_FListMenuItem)._vptr_FListMenuItem[0xd])
                         (pFVar3,(ulong)(uint)mkey,(ulong)fromcontroller), (char)iVar7 != '\0')) {
      return true;
    }
LAB_003373fa:
    bVar4 = DMenu::MenuEvent(&this->super_DMenu,mkey,fromcontroller);
    return bVar4;
  }
  iVar7 = FirstSelectable(this);
  this->mDesc->mSelectedItem = iVar7;
LAB_00337431:
  if (this->mDesc->mSelectedItem != uVar1) {
    iVar7 = S_FindSound("menu/cursor");
    uStack_38 = CONCAT44(iVar7,(undefined4)uStack_38);
    S_Sound(0x22,(FSoundID *)((long)&uStack_38 + 4),snd_menuvolume.Value,0.0);
  }
  return true;
}

Assistant:

bool DOptionMenu::MenuEvent (int mkey, bool fromcontroller)
{
	int startedAt = mDesc->mSelectedItem;

	switch (mkey)
	{
	case MKEY_Up:
		if (mDesc->mSelectedItem == -1)
		{
			mDesc->mSelectedItem = FirstSelectable();
			break;
		}
		do
		{
			--mDesc->mSelectedItem;

			if (mDesc->mScrollPos > 0 &&
				mDesc->mSelectedItem <= mDesc->mScrollTop + mDesc->mScrollPos)
			{
				mDesc->mScrollPos = MAX(mDesc->mSelectedItem - mDesc->mScrollTop - 1, 0);
			}

			if (mDesc->mSelectedItem < 0) 
			{
				// Figure out how many lines of text fit on the menu
				int y = mDesc->mPosition;

				if (y <= 0)
				{
					if (BigFont && mDesc->mTitle.IsNotEmpty())
					{
						y = -y + BigFont->GetHeight();
					}
					else
					{
						y = -y;
					}
				}
				y *= CleanYfac_1;
				int	rowheight = OptionSettings.mLinespacing * CleanYfac_1;
				int maxitems = (screen->GetHeight() - rowheight - y) / rowheight + 1;

				mDesc->mScrollPos = MAX (0, (int)mDesc->mItems.Size() - maxitems + mDesc->mScrollTop);
				mDesc->mSelectedItem = mDesc->mItems.Size()-1;
			}
		}
		while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable() && mDesc->mSelectedItem != startedAt);
		break;

	case MKEY_Down:
		if (mDesc->mSelectedItem == -1)
		{
			mDesc->mSelectedItem = FirstSelectable();
			break;
		}
		do
		{
			++mDesc->mSelectedItem;
			
			if (CanScrollDown && mDesc->mSelectedItem == VisBottom)
			{
				mDesc->mScrollPos++;
				VisBottom++;
			}
			if (mDesc->mSelectedItem >= (int)mDesc->mItems.Size()) 
			{
				if (startedAt == -1)
				{
					mDesc->mSelectedItem = -1;
					mDesc->mScrollPos = -1;
					break;
				}
				else
				{
					mDesc->mSelectedItem = 0;
					mDesc->mScrollPos = 0;
				}
			}
		}
		while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable() && mDesc->mSelectedItem != startedAt);
		break;

	case MKEY_PageUp:
		if (mDesc->mScrollPos > 0)
		{
			mDesc->mScrollPos -= VisBottom - mDesc->mScrollPos - mDesc->mScrollTop;
			if (mDesc->mScrollPos < 0)
			{
				mDesc->mScrollPos = 0;
			}
			if (mDesc->mSelectedItem != -1)
			{
				mDesc->mSelectedItem = mDesc->mScrollTop + mDesc->mScrollPos + 1;
				while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable())
				{
					if (++mDesc->mSelectedItem >= (int)mDesc->mItems.Size())
					{
						mDesc->mSelectedItem = 0;
					}
				}
				if (mDesc->mScrollPos > mDesc->mSelectedItem)
				{
					mDesc->mScrollPos = mDesc->mSelectedItem;
				}
			}
		}
		break;

	case MKEY_PageDown:
		if (CanScrollDown)
		{
			int pagesize = VisBottom - mDesc->mScrollPos - mDesc->mScrollTop;
			mDesc->mScrollPos += pagesize;
			if (mDesc->mScrollPos + mDesc->mScrollTop + pagesize > (int)mDesc->mItems.Size())
			{
				mDesc->mScrollPos = mDesc->mItems.Size() - mDesc->mScrollTop - pagesize;
			}
			if (mDesc->mSelectedItem != -1)
			{
				mDesc->mSelectedItem = mDesc->mScrollTop + mDesc->mScrollPos;
				while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable())
				{
					if (++mDesc->mSelectedItem >= (int)mDesc->mItems.Size())
					{
						mDesc->mSelectedItem = 0;
					}
				}
				if (mDesc->mScrollPos > mDesc->mSelectedItem)
				{
					mDesc->mScrollPos = mDesc->mSelectedItem;
				}
			}
		}
		break;

	case MKEY_Enter:
		if (mDesc->mSelectedItem >= 0 && mDesc->mItems[mDesc->mSelectedItem]->Activate()) 
		{
			return true;
		}
		// fall through to default
	default:
		if (mDesc->mSelectedItem >= 0 && 
			mDesc->mItems[mDesc->mSelectedItem]->MenuEvent(mkey, fromcontroller)) return true;
		return Super::MenuEvent(mkey, fromcontroller);
	}

	if (mDesc->mSelectedItem != startedAt)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
	}
	return true;
}